

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O2

float anon_unknown.dwarf_fdd22::drand(void)

{
  int iVar1;
  result_type_conflict rVar2;
  
  if ((anonymous_namespace)::drand()::generator == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::drand()::generator);
    if (iVar1 != 0) {
      drand::generator._M_x = 1;
      __cxa_guard_release(&(anonymous_namespace)::drand()::generator);
    }
  }
  if ((anonymous_namespace)::drand()::distribution == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::drand()::distribution);
    if (iVar1 != 0) {
      drand::distribution._M_param._M_a = 0.0;
      drand::distribution._M_param._M_b = 1.0;
      __cxa_guard_release(&(anonymous_namespace)::drand()::distribution);
    }
  }
  rVar2 = std::uniform_real_distribution<float>::operator()(&drand::distribution,&drand::generator);
  return rVar2;
}

Assistant:

float
drand ()
{
    static std::default_random_engine            generator;
    static std::uniform_real_distribution<float> distribution (0.0f, 1.0f);
    float                                        r = distribution (generator);
    return r;
}